

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

ctmbstr prvTidygetArgValueString(TidyMessageImpl message,TidyMessageArgument *arg)

{
  int iVar1;
  int argNum;
  TidyMessageArgument *arg_local;
  
  iVar1 = (int)*arg + -1;
  if (message.argcount < iVar1) {
    __assert_fail("argNum <= message.argcount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                  ,0x1bd,"ctmbstr prvTidygetArgValueString(TidyMessageImpl, TidyMessageArgument *)")
    ;
  }
  if (message.arguments[iVar1].type == tidyFormatType_STRING) {
    return (ctmbstr)message.arguments[iVar1].u.d;
  }
  __assert_fail("message.arguments[argNum].type == tidyFormatType_STRING",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                ,0x1be,"ctmbstr prvTidygetArgValueString(TidyMessageImpl, TidyMessageArgument *)");
}

Assistant:

ctmbstr TY_(getArgValueString)( TidyMessageImpl message, TidyMessageArgument* arg )
{
    int argNum = (int)(size_t)*arg - 1;
    assert( argNum <= message.argcount );
    assert( message.arguments[argNum].type == tidyFormatType_STRING);
    
    return message.arguments[argNum].u.s;
}